

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

char * ReplaceDefine(char *lp)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = ReplaceDefineInternal(lp,sline);
  if (bVar1) {
    iVar2 = 0xb;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        Error("Unable to finish substitions, line after 20th iteration",sline,SUPPRESS);
        return sline;
      }
      bVar1 = ReplaceDefineInternal(sline,sline2);
      if (!bVar1) {
        return sline2;
      }
      bVar1 = ReplaceDefineInternal(sline2,sline);
    } while (bVar1);
  }
  return sline;
}

Assistant:

char* ReplaceDefine(char* lp) {
	// do first replacement into sline buffer (and if no define replace done, just return it)
	if (!ReplaceDefineInternal(lp, sline)) return sline;
	// Some define were replaced, line is in "sline", now ping-pong it between sline and sline2
	int defineReplaceRecursion = 0;
	while (defineReplaceRecursion++ < 10) {
		if (!ReplaceDefineInternal(sline, sline2)) return sline2;
		if (!ReplaceDefineInternal(sline2, sline)) return sline;
	}
	Error("Unable to finish substitions, line after 20th iteration", sline, SUPPRESS);
	return sline;
}